

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_iterator_generate_data(uint32_t **values_out,uint32_t *count_out)

{
  int iVar1;
  uint32_t i;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  uint32_t i_2;
  uint32_t uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  puVar5 = (uint32_t *)malloc(4000000);
  puVar5[0] = 0;
  puVar5[1] = 0x4d20000;
  puVar5[2] = 0x4d4ffff;
  uVar2 = 0;
  for (lVar8 = 3; (int)lVar8 != 0x10003; lVar8 = lVar8 + 1) {
    puVar5[lVar8] = uVar2 | 0x4d60000;
    uVar2 = uVar2 + 1;
  }
  for (lVar8 = 0x20006; lVar8 != 0x30006; lVar8 = lVar8 + 2) {
    *(int *)((long)puVar5 + lVar8 * 2) = (int)lVar8 + 0x4d5fffa;
  }
  for (lVar8 = 0x30006; lVar8 != 0x40006; lVar8 = lVar8 + 2) {
    *(int *)((long)puVar5 + lVar8 * 2) = (int)lVar8 + 0x4d6fffb;
  }
  uVar7 = 0x4dc0000;
  for (lVar8 = 0x20003; lVar8 != 0x203f4; lVar8 = lVar8 + 1) {
    puVar5[lVar8] = uVar7;
    uVar7 = uVar7 + 0x41;
  }
  uVar2 = 0x203f4;
  iVar9 = 0;
  for (iVar3 = 0; iVar3 != 0x10000; iVar3 = iVar3 + 1) {
    iVar1 = iVar9 + 1;
    if (iVar3 != ((uint)((iVar9 + 2) * (iVar9 + 1)) >> 1) - 1) {
      uVar6 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      puVar5[uVar6] = iVar3 + 0x4de0000;
      iVar1 = iVar9;
    }
    iVar9 = iVar1;
  }
  uVar4 = uVar2 + 100;
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    puVar5[uVar2 + iVar3] = iVar3 + 0x4e0ff9c;
  }
  uVar2 = 0;
  iVar3 = 0x10000;
  while( true ) {
    uVar6 = (ulong)uVar4;
    bVar10 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar10) break;
    uVar4 = uVar4 + 1;
    puVar5[uVar6] = uVar2 | 0x4e10000;
    uVar2 = uVar2 + 1;
  }
  for (iVar3 = 0; uVar2 = uVar4 + iVar3, iVar3 != 100; iVar3 = iVar3 + 1) {
    puVar5[uVar2] = iVar3 + 0x4e20000;
  }
  for (uVar4 = 0; uVar4 < 0x10000;
      uVar4 = uVar4 + (int)(((ulong)seed & 0xffffffff3fffffff) % 10) + 1) {
    puVar5[uVar2] = uVar4 | 0x4e40000;
    seed = seed * 0x41c64e6d + 0x3039;
    uVar2 = uVar2 + 1;
  }
  puVar5[uVar2] = 0xffffffff;
  _assert_true((ulong)(uVar2 + 1 < 0xf4241),"count <= capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf58);
  *values_out = puVar5;
  *count_out = uVar2 + 1;
  return;
}

Assistant:

void test_iterator_generate_data(uint32_t **values_out, uint32_t *count_out) {
    const size_t capacity = 1000 * 1000;
    uint32_t *values =
        (uint32_t *)malloc(sizeof(uint32_t) * capacity);  // ascending order
    uint32_t count = 0;
    uint32_t base = 1234;  // container index

    // min allowed value
    values[count++] = 0;

    // only the very first value in container is set
    values[count++] = base * 65536;
    base += 2;

    // only the very last value in container is set
    values[count++] = base * 65536 + 65535;
    base += 2;

    // fully filled container
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // even values
    for (uint32_t i = 0; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // odd values
    for (uint32_t i = 1; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // each next 64-bit word is ROR'd by one
    for (uint32_t i = 0; i < 65536; i += 65) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // runs of increasing length: 0, 1,0, 1,1,0, 1,1,1,0, ...
    for (uint32_t i = 0, run_index = 0; i < 65536; i++) {
        if (i != (run_index + 1) * (run_index + 2) / 2 - 1) {
            values[count++] = base * 65536 + i;
        } else {
            run_index++;
        }
    }
    base += 2;

    // 00000XX, XXXXXX, XX0000
    for (uint32_t i = 65536 - 100; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 100; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // random
    for (int i = 0; i < 65536; i += our_rand() % 10 + 1) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // max allowed value
    values[count++] = UINT32_MAX;

    assert_true(count <= capacity);
    *values_out = values;
    *count_out = count;
}